

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

void split_conic(FT_26D6_Vec *base)

{
  int iVar1;
  int iVar2;
  FT_26D6 b;
  FT_26D6 a;
  FT_26D6_Vec *base_local;
  
  base[4].x = base[2].x;
  iVar1 = (int)base->x + (int)base[1].x;
  iVar2 = (int)base[1].x + (int)base[2].x;
  base[3].x = (long)(iVar2 / 2);
  base[2].x = (long)((iVar1 + iVar2) / 4);
  base[1].x = (long)(iVar1 / 2);
  base[4].y = base[2].y;
  iVar1 = (int)base->y + (int)base[1].y;
  iVar2 = (int)base[1].y + (int)base[2].y;
  base[3].y = (long)(iVar2 / 2);
  base[2].y = (long)((iVar1 + iVar2) / 4);
  base[1].y = (long)(iVar1 / 2);
  return;
}

Assistant:

static void
  split_conic( FT_26D6_Vec*  base )
  {
    FT_26D6  a, b;


    base[4].x = base[2].x;
    a         = base[0].x + base[1].x;
    b         = base[1].x + base[2].x;
    base[3].x = b / 2;
    base[2].x = ( a + b ) / 4;
    base[1].x = a / 2;

    base[4].y = base[2].y;
    a         = base[0].y + base[1].y;
    b         = base[1].y + base[2].y;
    base[3].y = b / 2;
    base[2].y = ( a + b ) / 4;
    base[1].y = a / 2;
  }